

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckColorAvailable(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level1_Enabled(doc);
  if (BVar1 != no) {
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_IMG)) {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_APPLET)
         ) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
           (node->tag->id != TidyTag_OBJECT)) {
          if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
             (node->tag->id != TidyTag_SCRIPT)) {
            if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
               (node->tag->id == TidyTag_INPUT)) {
              prvTidyReportAccessWarning(doc,node,0x146);
            }
          }
          else {
            prvTidyReportAccessWarning(doc,node,0x145);
          }
        }
        else {
          prvTidyReportAccessWarning(doc,node,0x144);
        }
      }
      else {
        prvTidyReportAccessWarning(doc,node,0x143);
      }
    }
    else {
      prvTidyReportAccessWarning(doc,node,0x142);
    }
  }
  return;
}

Assistant:

static void CheckColorAvailable( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        if ( nodeIsIMG(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_IMAGE );

        else if ( nodeIsAPPLET(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_APPLET );

        else if ( nodeIsOBJECT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_OBJECT );

        else if ( nodeIsSCRIPT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_SCRIPT );

        else if ( nodeIsINPUT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_INPUT );
    }
}